

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-bin-cursor.c
# Opt level: O1

int coda_bin_cursor_read_int32_array
              (coda_cursor_conflict *cursor,int32_t *dst,coda_array_ordering array_ordering)

{
  int iVar1;
  coda_type *pcVar2;
  int iVar3;
  
  pcVar2 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar2->format) {
    pcVar2 = *(coda_type **)&pcVar2->type_class;
  }
  if ((*(coda_type **)(pcVar2 + 1))->format == coda_format_ascii) {
    iVar1 = read_array(cursor,coda_ascii_cursor_read_int32,(uint8_t *)dst,4,coda_array_ordering_c);
    iVar3 = -1;
    if (iVar1 == 0) {
      if ((array_ordering != coda_array_ordering_c) &&
         (iVar1 = transpose_array(cursor,dst,4), iVar1 != 0)) {
        return -1;
      }
      iVar3 = 0;
    }
    return iVar3;
  }
  if ((*(coda_type **)(pcVar2 + 1))->format != coda_format_binary) {
    __assert_fail("type->base_type->format == coda_format_ascii",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-bin-cursor.c"
                  ,0x3f2,
                  "int coda_bin_cursor_read_int32_array(const coda_cursor *, int32_t *, coda_array_ordering)"
                 );
  }
  iVar1 = read_array(cursor,coda_bin_cursor_read_int32,(uint8_t *)dst,4,array_ordering);
  return iVar1;
}

Assistant:

int coda_bin_cursor_read_int32_array(const coda_cursor *cursor, int32_t *dst, coda_array_ordering array_ordering)
{
    coda_type_array *type = (coda_type_array *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    if (type->base_type->format == coda_format_binary)
    {
        return read_array(cursor, (read_function)&coda_bin_cursor_read_int32, (uint8_t *)dst, sizeof(int32_t),
                          array_ordering);
    }
    assert(type->base_type->format == coda_format_ascii);
    if (read_array(cursor, (read_function)&coda_ascii_cursor_read_int32, (uint8_t *)dst, sizeof(int32_t),
                   coda_array_ordering_c) != 0)
    {
        return -1;
    }
    if (array_ordering != coda_array_ordering_c)
    {
        if (transpose_array(cursor, dst, sizeof(int32_t)) != 0)
        {
            return -1;
        }
    }

    return 0;
}